

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::FeatureType::FeatureType(FeatureType *this,FeatureType *from)

{
  void *pvVar1;
  Int64FeatureType *this_00;
  Int64FeatureType *from_00;
  ArrayFeatureType *this_01;
  ArrayFeatureType *from_01;
  StringFeatureType *this_02;
  StringFeatureType *from_02;
  ImageFeatureType *this_03;
  ImageFeatureType *from_03;
  DoubleFeatureType *this_04;
  DoubleFeatureType *from_04;
  DictionaryFeatureType *this_05;
  DictionaryFeatureType *from_05;
  SequenceFeatureType *this_06;
  SequenceFeatureType *from_06;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FeatureType_00393040;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->isoptional_ = from->isoptional_;
  this->_oneof_case_[0] = 0;
  switch(from->_oneof_case_[0]) {
  case 1:
    this_00 = mutable_int64type(this);
    from_00 = int64type(from);
    Int64FeatureType::MergeFrom(this_00,from_00);
    break;
  case 2:
    this_04 = mutable_doubletype(this);
    from_04 = doubletype(from);
    DoubleFeatureType::MergeFrom(this_04,from_04);
    break;
  case 3:
    this_02 = mutable_stringtype(this);
    from_02 = stringtype(from);
    StringFeatureType::MergeFrom(this_02,from_02);
    break;
  case 4:
    this_03 = mutable_imagetype(this);
    from_03 = imagetype(from);
    ImageFeatureType::MergeFrom(this_03,from_03);
    break;
  case 5:
    this_01 = mutable_multiarraytype(this);
    from_01 = multiarraytype(from);
    ArrayFeatureType::MergeFrom(this_01,from_01);
    break;
  case 6:
    this_05 = mutable_dictionarytype(this);
    from_05 = dictionarytype(from);
    DictionaryFeatureType::MergeFrom(this_05,from_05);
    break;
  case 7:
    this_06 = mutable_sequencetype(this);
    from_06 = sequencetype(from);
    SequenceFeatureType::MergeFrom(this_06,from_06);
  }
  return;
}

Assistant:

FeatureType::FeatureType(const FeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  isoptional_ = from.isoptional_;
  clear_has_Type();
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kDoubleType: {
      mutable_doubletype()->::CoreML::Specification::DoubleFeatureType::MergeFrom(from.doubletype());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case kImageType: {
      mutable_imagetype()->::CoreML::Specification::ImageFeatureType::MergeFrom(from.imagetype());
      break;
    }
    case kMultiArrayType: {
      mutable_multiarraytype()->::CoreML::Specification::ArrayFeatureType::MergeFrom(from.multiarraytype());
      break;
    }
    case kDictionaryType: {
      mutable_dictionarytype()->::CoreML::Specification::DictionaryFeatureType::MergeFrom(from.dictionarytype());
      break;
    }
    case kSequenceType: {
      mutable_sequencetype()->::CoreML::Specification::SequenceFeatureType::MergeFrom(from.sequencetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FeatureType)
}